

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall OpenMD::NameFinder::matchMolecule(NameFinder *this,string *molName,SelectionSet *bs)

{
  bool bVar1;
  iterator this_00;
  NameFinder *in_RDX;
  SelectionSet *in_RDI;
  iterator i;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  SelectionSet *this_01;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_58 [3];
  SelectionSet local_40;
  string *in_stack_ffffffffffffffd8;
  TreeNodePtr *in_stack_ffffffffffffffe0;
  
  this_01 = &local_40;
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)this_01,(shared_ptr<OpenMD::TreeNode> *)in_RDI);
  getMatchedChildren(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ee8f3);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  ::__normal_iterator(local_58);
  this_00 = std::
            vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
            ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                     *)in_RDI);
  local_58[0]._M_current = (shared_ptr<OpenMD::TreeNode> *)this_00;
  while( true ) {
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
         *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)this_01,
                       (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator*(local_58);
    std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2ee94c);
    SelectionSet::operator|=(this_01,in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator++(local_58);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           *)this_00._M_current);
  return;
}

Assistant:

void NameFinder::matchMolecule(const std::string& molName, SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      bs |= (*i)->bs;
    }
  }